

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O1

void __thiscall ASDCP::MXF::TimecodeComponent::Dump(TimecodeComponent *this,FILE *stream)

{
  char identbuf [128];
  char local_a8 [136];
  
  local_a8[0] = '\0';
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  StructuralComponent::Dump(&this->super_StructuralComponent,stream);
  fprintf((FILE *)stream,"  %22s = %d\n","RoundedTimecodeBase",(ulong)this->RoundedTimecodeBase);
  snprintf(local_a8,0x40,"%lld",this->StartTimecode);
  fprintf((FILE *)stream,"  %22s = %s\n","StartTimecode",local_a8);
  fprintf((FILE *)stream,"  %22s = %d\n","DropFrame",(ulong)this->DropFrame);
  return;
}

Assistant:

void
TimecodeComponent::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  StructuralComponent::Dump(stream);
  fprintf(stream, "  %22s = %d\n",  "RoundedTimecodeBase", RoundedTimecodeBase);
  fprintf(stream, "  %22s = %s\n",  "StartTimecode", i64sz(StartTimecode, identbuf));
  fprintf(stream, "  %22s = %d\n",  "DropFrame", DropFrame);
}